

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol.c
# Opt level: O0

int KINInit(void *kinmem,KINSysFn func,N_Vector tmpl)

{
  bool bVar1;
  int iVar2;
  N_Vector in_RDX;
  KINSysFn in_RSI;
  KINMem in_RDI;
  int dotprodSB;
  int nvectorOK;
  int allocOK;
  KINMem kin_mem;
  sunindextype lrw1;
  sunindextype liw1;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  sunindextype local_30;
  sunindextype local_28;
  N_Vector local_20;
  KINSysFn local_18;
  int local_4;
  
  if (in_RDI == (KINMem)0x0) {
    KINProcessError((KINMem)0x0,-1,0x14d,"KINInit",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/kinsol/kinsol.c"
                    ,"kinsol_mem = NULL illegal.");
    local_4 = -1;
  }
  else if (in_RSI == (KINSysFn)0x0) {
    KINProcessError(in_RDI,-2,0x156,"KINInit",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/kinsol/kinsol.c"
                    ,"func = NULL illegal.");
    local_4 = -2;
  }
  else {
    local_20 = in_RDX;
    local_18 = in_RSI;
    iVar2 = KINCheckNvector(in_RDX);
    if (iVar2 == 0) {
      KINProcessError(in_RDI,-2,0x161,"KINInit",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/kinsol/kinsol.c"
                      ,"A required vector operation is not implemented.");
      local_4 = -2;
    }
    else {
      if (local_20->ops->nvspace == (_func_void_N_Vector_sunindextype_ptr_sunindextype_ptr *)0x0) {
        in_RDI->kin_lrw1 = 0;
        in_RDI->kin_liw1 = 0;
      }
      else {
        N_VSpace(local_20,&local_30,&local_28);
        in_RDI->kin_lrw1 = local_30;
        in_RDI->kin_liw1 = local_28;
      }
      iVar2 = KINAllocVectors((KINMem)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                              (N_Vector)0x108050);
      if (iVar2 == 0) {
        KINProcessError(in_RDI,-4,0x17a,"KINInit",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/kinsol/kinsol.c"
                        ,"A memory request failed.");
        free(in_RDI);
        local_4 = -4;
      }
      else {
        in_RDI->kin_func = local_18;
        in_RDI->kin_linit = (_func_int_KINMemRec_ptr *)0x0;
        in_RDI->kin_lsetup = (_func_int_KINMemRec_ptr *)0x0;
        in_RDI->kin_lsolve =
             (_func_int_KINMemRec_ptr_N_Vector_N_Vector_sunrealtype_ptr_sunrealtype_ptr *)0x0;
        in_RDI->kin_lfree = (_func_int_KINMemRec_ptr *)0x0;
        in_RDI->kin_lmem = (void *)0x0;
        if (in_RDI->kin_m_aa != 0) {
          bVar1 = false;
          if (((in_RDI->kin_vtemp2->ops->nvdotprodlocal !=
                (_func_sunrealtype_N_Vector_N_Vector *)0x0) ||
              (in_RDI->kin_vtemp2->ops->nvdotprodmultilocal !=
               (_func_SUNErrCode_int_N_Vector_N_Vector_ptr_sunrealtype_ptr *)0x0)) &&
             (in_RDI->kin_vtemp2->ops->nvdotprodmultiallreduce !=
              (_func_SUNErrCode_int_N_Vector_sunrealtype_ptr *)0x0)) {
            bVar1 = true;
          }
          if (in_RDI->kin_orth_aa == 0) {
            in_RDI->kin_qr_func = SUNQRAdd_MGS;
            in_RDI->kin_qr_data->vtemp = in_RDI->kin_vtemp2;
          }
          else if (in_RDI->kin_orth_aa == 1) {
            if (bVar1) {
              in_RDI->kin_qr_func = SUNQRAdd_ICWY_SB;
            }
            else {
              in_RDI->kin_qr_func = SUNQRAdd_ICWY;
            }
            in_RDI->kin_qr_data->vtemp = in_RDI->kin_vtemp2;
            in_RDI->kin_qr_data->vtemp2 = in_RDI->kin_vtemp3;
            in_RDI->kin_qr_data->temp_array = in_RDI->kin_T_aa;
          }
          else if (in_RDI->kin_orth_aa == 2) {
            in_RDI->kin_qr_func = SUNQRAdd_CGS2;
            in_RDI->kin_qr_data->vtemp = in_RDI->kin_vtemp2;
            in_RDI->kin_qr_data->vtemp2 = in_RDI->kin_vtemp3;
            in_RDI->kin_qr_data->temp_array = in_RDI->kin_cv;
          }
          else if (in_RDI->kin_orth_aa == 3) {
            if (bVar1) {
              in_RDI->kin_qr_func = SUNQRAdd_DCGS2_SB;
            }
            else {
              in_RDI->kin_qr_func = SUNQRAdd_DCGS2;
            }
            in_RDI->kin_qr_data->vtemp = in_RDI->kin_vtemp2;
            in_RDI->kin_qr_data->vtemp2 = in_RDI->kin_vtemp3;
            in_RDI->kin_qr_data->temp_array = in_RDI->kin_cv;
          }
        }
        in_RDI->kin_MallocDone = 1;
        local_4 = 0;
      }
    }
  }
  return local_4;
}

Assistant:

int KINInit(void* kinmem, KINSysFn func, N_Vector tmpl)
{
  sunindextype liw1, lrw1;
  KINMem kin_mem;
  sunbooleantype allocOK, nvectorOK, dotprodSB;

  /* check kinmem */

  if (kinmem == NULL)
  {
    KINProcessError(NULL, KIN_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (KIN_MEM_NULL);
  }
  kin_mem = (KINMem)kinmem;

  SUNDIALS_MARK_FUNCTION_BEGIN(KIN_PROFILER);

  if (func == NULL)
  {
    KINProcessError(kin_mem, KIN_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_FUNC_NULL);
    SUNDIALS_MARK_FUNCTION_END(KIN_PROFILER);
    return (KIN_ILL_INPUT);
  }

  /* check if all required vector operations are implemented */

  nvectorOK = KINCheckNvector(tmpl);
  if (!nvectorOK)
  {
    KINProcessError(kin_mem, KIN_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_BAD_NVECTOR);
    SUNDIALS_MARK_FUNCTION_END(KIN_PROFILER);
    return (KIN_ILL_INPUT);
  }

  /* set space requirements for one N_Vector */

  if (tmpl->ops->nvspace != NULL)
  {
    N_VSpace(tmpl, &lrw1, &liw1);
    kin_mem->kin_lrw1 = lrw1;
    kin_mem->kin_liw1 = liw1;
  }
  else
  {
    kin_mem->kin_lrw1 = 0;
    kin_mem->kin_liw1 = 0;
  }

  /* allocate necessary vectors */

  allocOK = KINAllocVectors(kin_mem, tmpl);
  if (!allocOK)
  {
    KINProcessError(kin_mem, KIN_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSG_MEM_FAIL);
    free(kin_mem);
    kin_mem = NULL;
    SUNDIALS_MARK_FUNCTION_END(KIN_PROFILER);
    return (KIN_MEM_FAIL);
  }

  /* copy the input parameter into KINSol state */

  kin_mem->kin_func = func;

  /* set the linear solver addresses to NULL */

  kin_mem->kin_linit  = NULL;
  kin_mem->kin_lsetup = NULL;
  kin_mem->kin_lsolve = NULL;
  kin_mem->kin_lfree  = NULL;
  kin_mem->kin_lmem   = NULL;

  /* initialize the QRData and set the QRAdd function if Anderson Acceleration is being used */
  if (kin_mem->kin_m_aa != 0)
  {
    dotprodSB = SUNFALSE;
    if ((kin_mem->kin_vtemp2->ops->nvdotprodlocal ||
         kin_mem->kin_vtemp2->ops->nvdotprodmultilocal) &&
        kin_mem->kin_vtemp2->ops->nvdotprodmultiallreduce)
    {
      dotprodSB = SUNTRUE;
    }

    if (kin_mem->kin_orth_aa == KIN_ORTH_MGS)
    {
      kin_mem->kin_qr_func        = (SUNQRAddFn)SUNQRAdd_MGS;
      kin_mem->kin_qr_data->vtemp = kin_mem->kin_vtemp2;
    }
    else if (kin_mem->kin_orth_aa == KIN_ORTH_ICWY)
    {
      if (dotprodSB) { kin_mem->kin_qr_func = (SUNQRAddFn)SUNQRAdd_ICWY_SB; }
      else { kin_mem->kin_qr_func = (SUNQRAddFn)SUNQRAdd_ICWY; }
      kin_mem->kin_qr_data->vtemp      = kin_mem->kin_vtemp2;
      kin_mem->kin_qr_data->vtemp2     = kin_mem->kin_vtemp3;
      kin_mem->kin_qr_data->temp_array = kin_mem->kin_T_aa;
    }
    else if (kin_mem->kin_orth_aa == KIN_ORTH_CGS2)
    {
      kin_mem->kin_qr_func             = (SUNQRAddFn)SUNQRAdd_CGS2;
      kin_mem->kin_qr_data->vtemp      = kin_mem->kin_vtemp2;
      kin_mem->kin_qr_data->vtemp2     = kin_mem->kin_vtemp3;
      kin_mem->kin_qr_data->temp_array = kin_mem->kin_cv;
    }
    else if (kin_mem->kin_orth_aa == KIN_ORTH_DCGS2)
    {
      if (dotprodSB) { kin_mem->kin_qr_func = (SUNQRAddFn)SUNQRAdd_DCGS2_SB; }
      else { kin_mem->kin_qr_func = (SUNQRAddFn)SUNQRAdd_DCGS2; }
      kin_mem->kin_qr_data->vtemp      = kin_mem->kin_vtemp2;
      kin_mem->kin_qr_data->vtemp2     = kin_mem->kin_vtemp3;
      kin_mem->kin_qr_data->temp_array = kin_mem->kin_cv;
    }
  }

  /* problem memory has been successfully allocated */

  kin_mem->kin_MallocDone = SUNTRUE;

  SUNDIALS_MARK_FUNCTION_END(KIN_PROFILER);
  return (KIN_SUCCESS);
}